

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  uint uVar10;
  ostream *poVar11;
  double *pdVar12;
  int i_2;
  undefined1 *puVar13;
  int j;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int j_2;
  double (*padVar17) [4];
  int i;
  long lVar18;
  bool bVar19;
  Mat4x4 tm;
  Mat4x4 prod;
  double local_238;
  undefined1 local_230 [8];
  undefined8 uStack_228;
  undefined8 local_220;
  double adStack_218 [12];
  Mat4x4 local_1b8;
  double local_130 [32];
  
  padVar17 = (double (*) [4])&local_1b8;
  local_1b8.d[0][0] = 11.0;
  local_1b8.d[0][1] = 10.0;
  local_1b8.d[0][2] = 4.0;
  local_1b8.d[0][3] = 6.0;
  local_1b8.d[1][0] = 9.0;
  local_1b8.d[1][1] = 8.0;
  local_1b8.d[1][2] = 7.0;
  local_1b8.d[1][3] = 12.0;
  local_1b8.d[2][0] = 13.0;
  local_1b8.d[2][1] = 14.0;
  local_1b8.d[2][2] = 15.0;
  local_1b8.d[2][3] = 16.0;
  local_1b8.d[3][0] = 17.0;
  local_1b8.d[3][1] = 3.0;
  local_1b8.d[3][2] = 5.0;
  local_1b8.d[3][3] = 18.0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"M:\n",3);
  lVar18 = 0;
  do {
    lVar14 = 0;
    do {
      poVar11 = std::ostream::_M_insert<double>((*(double (*) [4])*padVar17)[lVar14]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    std::ostream::_M_insert<double>(local_1b8.d[lVar18][3]);
    if (lVar18 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    }
    lVar18 = lVar18 + 1;
    padVar17 = padVar17 + 1;
  } while (lVar18 != 4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  padVar17 = (double (*) [4])local_130;
  phyr::_Mat4x4::inverse((Mat4x4 *)padVar17,&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nInverse M:\n",0xc);
  lVar18 = 0;
  do {
    lVar14 = 0;
    do {
      poVar11 = std::ostream::_M_insert<double>((*(double (*) [4])*padVar17)[lVar14]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    std::ostream::_M_insert<double>(local_130[lVar18 * 4 + 3]);
    if (lVar18 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    }
    lVar18 = lVar18 + 1;
    padVar17 = padVar17 + 1;
  } while (lVar18 != 4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  pdVar12 = local_130 + 0x10;
  local_130[0x1f] = 1.0;
  local_130[0x1a] = 1.0;
  local_130[0x15] = 1.0;
  local_130[0x10] = 1.0;
  local_130[0x11] = 0.0;
  local_130[0x12] = 0.0;
  local_130[0x13] = 0.0;
  local_130[0x14] = 0.0;
  local_130[0x16] = 0.0;
  local_130[0x17] = 0.0;
  local_130[0x18] = 0.0;
  local_130[0x19] = 0.0;
  local_130[0x1b] = 0.0;
  local_130[0x1c] = 0.0;
  local_130[0x1d] = 0.0;
  local_130[0x1e] = 0.0;
  lVar18 = 0;
  do {
    dVar2 = local_1b8.d[lVar18][0];
    dVar3 = local_1b8.d[lVar18][1];
    dVar4 = local_1b8.d[lVar18][2];
    dVar5 = local_1b8.d[lVar18][3];
    lVar14 = 0;
    do {
      dVar6 = local_130[lVar14 + 1];
      dVar7 = local_130[lVar14 + 5];
      dVar8 = local_130[lVar14 + 9];
      dVar9 = local_130[lVar14 + 0xd];
      pdVar12[lVar14] =
           local_130[lVar14 + 0xc] * dVar5 +
           local_130[lVar14 + 8] * dVar4 + local_130[lVar14 + 4] * dVar3 + local_130[lVar14] * dVar2
      ;
      (pdVar12 + lVar14)[1] = dVar9 * dVar5 + dVar8 * dVar4 + dVar7 * dVar3 + dVar6 * dVar2;
      lVar14 = lVar14 + 2;
    } while (lVar14 != 4);
    lVar18 = lVar18 + 1;
    pdVar12 = pdVar12 + 4;
  } while (lVar18 != 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nProduct:\n",10);
  *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) =
       *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  pdVar12 = local_130 + 0x10;
  lVar18 = 0;
  do {
    lVar14 = 0;
    do {
      poVar11 = std::ostream::_M_insert<double>(pdVar12[lVar14]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    std::ostream::_M_insert<double>(local_130[lVar18 * 4 + 0x13]);
    if (lVar18 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    }
    lVar18 = lVar18 + 1;
    pdVar12 = pdVar12 + 4;
  } while (lVar18 != 4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  adStack_218[0xb] = 1.0;
  adStack_218[6] = 1.0;
  adStack_218[1] = 1.0;
  uStack_228 = 0;
  local_220 = 0;
  adStack_218[0] = 0.0;
  adStack_218[2] = 0.0;
  adStack_218[3] = 0.0;
  adStack_218[4] = 0.0;
  adStack_218[5] = 0.0;
  adStack_218[7] = 0.0;
  adStack_218[8] = 0.0;
  adStack_218[9] = 0.0;
  adStack_218[10] = 0.0;
  uVar10 = 1;
  if ((local_1b8.d[0][0] == 1.0) && (!NAN(local_1b8.d[0][0]))) {
    pdVar12 = local_1b8.d[0] + 1;
    puVar13 = local_230;
    bVar19 = false;
    uVar15 = 0;
    while( true ) {
      uVar16 = 0xffffffffffffffff;
      do {
        if (uVar16 == 2) goto LAB_0010163c;
        lVar14 = uVar16 + 1;
        uVar1 = uVar16 + 1;
        lVar18 = uVar16 * 8;
      } while ((pdVar12[lVar14] == *(double *)(puVar13 + lVar18 + 8)) &&
              (uVar16 = uVar1, !NAN(pdVar12[lVar14]) && !NAN(*(double *)(puVar13 + lVar18 + 8))));
      if (uVar1 < 3) break;
LAB_0010163c:
      bVar19 = 2 < uVar15;
      if (uVar15 + 1 == 4) break;
      dVar2 = local_1b8.d[uVar15 + 1][0];
      pdVar12 = pdVar12 + 4;
      puVar13 = puVar13 + 0x20;
      lVar18 = uVar15 * 4;
      if ((dVar2 != (&local_238)[lVar18 + 4]) ||
         (uVar15 = uVar15 + 1, NAN(dVar2) || NAN((&local_238)[lVar18 + 4]))) break;
    }
    uVar10 = (byte)~bVar19 & 1;
  }
  return uVar10;
}

Assistant:

int main(int argc, const char* argv[]) {
    phyr::Mat4x4 m(11, 10, 4, 6, 9, 8, 7, 12,
                   13, 14, 15, 16, 17, 3, 5, 18);
    std::cout << "M:\n";
    std::cout << m << std::endl;

    phyr::Mat4x4 tm = phyr::Mat4x4::inverse(m);
    std::cout << "\nInverse M:\n";
    std::cout << tm << std::endl;

    phyr::Mat4x4 prod = m * tm;
    std::cout << "\nProduct:\n";
    std::cout << std::fixed << prod << std::endl;

    return m == phyr::Mat4x4() ? 0 : 1;
}